

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

void google::ReprintFatalMessage(void)

{
  size_t sVar1;
  
  if (fatal_message != '\0') {
    sVar1 = strlen(&fatal_message);
    if (fLB::FLAGS_logtostderr == '\0') {
      WriteToStderr(&fatal_message,(long)(int)sVar1);
    }
    LogDestination::LogToAllLogfiles(2,fatal_time,&fatal_message,(long)(int)sVar1);
    return;
  }
  return;
}

Assistant:

void ReprintFatalMessage() {
  if (fatal_message[0]) {
    const int n = strlen(fatal_message);
    if (!FLAGS_logtostderr) {
      // Also write to stderr (don't color to avoid terminal checks)
      WriteToStderr(fatal_message, n);
    }
    LogDestination::LogToAllLogfiles(GLOG_ERROR, fatal_time, fatal_message, n);
  }
}